

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O1

void __thiscall
google::protobuf::io::CodedOutputStream::CodedOutputStream
          (CodedOutputStream *this,ZeroCopyOutputStream *output)

{
  this->output_ = output;
  this->buffer_ = (uint8 *)0x0;
  this->buffer_size_ = 0;
  this->total_bytes_ = 0;
  this->had_error_ = false;
  Refresh(this);
  this->had_error_ = false;
  return;
}

Assistant:

CodedOutputStream::CodedOutputStream(ZeroCopyOutputStream* output)
  : output_(output),
    buffer_(NULL),
    buffer_size_(0),
    total_bytes_(0),
    had_error_(false) {
  // Eagerly Refresh() so buffer space is immediately available.
  Refresh();
  // The Refresh() may have failed. If the client doesn't write any data,
  // though, don't consider this an error. If the client does write data, then
  // another Refresh() will be attempted and it will set the error once again.
  had_error_ = false;
}